

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<TestBaseType>_(),_std::shared_ptr<TestBaseType>_(*)()>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<TestBaseType>_(),_std::shared_ptr<TestBaseType>_(*)()>
           *this,_func_shared_ptr<TestBaseType> *f)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_51;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_50;
  Type_Info local_38;
  
  local_38.m_flags = 0;
  local_38._20_4_ = 0;
  local_38.m_type_info = (type_info *)&std::shared_ptr<TestBaseType>::typeinfo;
  local_38.m_bare_type_info = (type_info *)&TestBaseType::typeinfo;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_50,__l,&local_51);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_50);
  if (local_50.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00177480;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }